

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::processQueryCommand(CommonCore *this,ActionMessage *cmd)

{
  GlobalFederateId global_fedid;
  _func_int *UNRECOVERED_JUMPTABLE;
  size_t __n;
  _Alloc_hider _Var1;
  size_type __n_00;
  short extraout_AX;
  int iVar2;
  int iVar3;
  BaseType BVar4;
  route_id rVar5;
  string *psVar6;
  mapped_type *pmVar7;
  FederateState *fed;
  bool force_ordering;
  action_t aVar8;
  string_view federateName;
  string_view queryStr;
  string_view queryStr_00;
  string_view queryStr_01;
  string repStr;
  ActionMessage queryResp;
  string local_128;
  ActionMessage local_108;
  string local_50;
  
  aVar8 = cmd->messageAction;
  if (aVar8 < cmd_query_ordered) {
    if (aVar8 == cmd_query_reply) {
LAB_002b1798:
      global_fedid.gid = (cmd->dest_id).gid;
      if (global_fedid.gid == (this->super_BrokerBase).global_broker_id_local.gid ||
          global_fedid.gid == -0x396fe) {
        processQueryResponse(this,cmd);
        return;
      }
      rVar5 = getRoute(this,global_fedid);
      UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
      (*UNRECOVERED_JUMPTABLE)(this,(ulong)(uint)rVar5.rid,cmd,UNRECOVERED_JUMPTABLE);
      return;
    }
    force_ordering = false;
    if (aVar8 == cmd_query) goto LAB_002b17d2;
    if (aVar8 != cmd_broker_query) {
      return;
    }
  }
  else {
    if (aVar8 == cmd_query_ordered) {
      force_ordering = true;
LAB_002b17d2:
      if ((cmd->dest_id).gid == 0) {
        if ((cmd->source_id).gid == -0x396fe) {
          if ((this->queryTimeouts).
              super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (this->queryTimeouts).
              super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
          }
          local_108._0_8_ = std::chrono::_V2::steady_clock::now();
          std::
          deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
          ::
          emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                      *)&this->queryTimeouts,&cmd->messageID,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&local_108);
        }
        psVar6 = ActionMessage::getString_abi_cxx11_(cmd,0);
        iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(psVar6,"root");
        if ((iVar3 == 0) ||
           (iVar3 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (psVar6,"federation"), iVar3 == 0)) {
          aVar8 = cmd_broker_query;
          if (force_ordering != false) {
            aVar8 = cmd_broker_query_ordered;
          }
          ActionMessage::setAction(cmd,aVar8);
          BVar4 = 1;
        }
        else {
          iVar3 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (psVar6,"parent");
          if ((iVar3 != 0) &&
             (iVar3 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (psVar6,"broker"), iVar3 != 0)) goto LAB_002b18d7;
          aVar8 = cmd_broker_query;
          if (force_ordering != false) {
            aVar8 = cmd_broker_query_ordered;
          }
          ActionMessage::setAction(cmd,aVar8);
          BVar4 = (this->super_BrokerBase).higher_broker_id.gid;
        }
        (cmd->dest_id).gid = BVar4;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&cmd->stringData,
                          (cmd->stringData).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
LAB_002b18d7:
        iVar3 = (this->super_BrokerBase).global_broker_id_local.gid;
        if (iVar3 != 0) {
          (cmd->source_id).gid = iVar3;
          (*(this->super_Core)._vptr_Core[0x6c])(this,0,cmd);
          return;
        }
        (cmd->source_id).gid = -0x396fe;
        gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::
        push<helics::ActionMessage>(&this->delayTransmitQueue,cmd);
        return;
      }
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      aVar8 = cmd_query_reply;
      if (force_ordering != false) {
        aVar8 = cmd_query_reply_ordered;
      }
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      ActionMessage::ActionMessage(&local_108,aVar8);
      local_108.dest_id.gid = (cmd->source_id).gid;
      local_108.source_id.gid = (cmd->dest_id).gid;
      local_108.messageID = cmd->messageID;
      local_108.counter = cmd->counter;
      psVar6 = ActionMessage::getString_abi_cxx11_(cmd,0);
      __n = psVar6->_M_string_length;
      if ((__n == (this->super_BrokerBase).identifier._M_string_length) &&
         ((__n == 0 ||
          (iVar3 = bcmp((psVar6->_M_dataplus)._M_p,
                        (this->super_BrokerBase).identifier._M_dataplus._M_p,__n), iVar3 == 0)))) {
        local_108.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        queryStr_00._M_str = (char *)(cmd->payload).heap;
        queryStr_00._M_len = (cmd->payload).bufferSize;
        coreQuery_abi_cxx11_(&local_50,this,queryStr_00,force_ordering);
        processQueryCommand();
LAB_002b1c53:
        __n_00 = local_128._M_string_length;
        _Var1._M_p = local_128._M_dataplus._M_p;
        if ((byte *)local_128._M_dataplus._M_p == local_108.payload.heap) {
          local_108.payload.bufferSize = local_128._M_string_length;
        }
        else {
          SmallBuffer::reserve(&local_108.payload,local_128._M_string_length);
          local_108.payload.bufferSize = __n_00;
          if (__n_00 != 0) {
            memcpy(local_108.payload.heap,_Var1._M_p,__n_00);
          }
        }
        if (local_108.dest_id.gid == -0x396fe) {
          processQueryResponse(this,&local_108);
        }
        else {
          rVar5 = getRoute(this,local_108.dest_id);
          (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)(uint)rVar5.rid,&local_108);
        }
      }
      else {
        federateName._M_str = (psVar6->_M_dataplus)._M_p;
        federateName._M_len = __n;
        fed = getFederateCore(this,federateName);
        queryStr_01._M_str = (char *)(cmd->payload).heap;
        queryStr_01._M_len = (cmd->payload).bufferSize;
        federateQuery_abi_cxx11_(&local_50,this,fed,queryStr_01,force_ordering);
        processQueryCommand();
        if (extraout_AX == 0) goto LAB_002b1c53;
        if (extraout_AX == 1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                    "#error");
          goto LAB_002b1c53;
        }
        (cmd->dest_id).gid = (fed->global_id)._M_i.gid;
        FederateState::addAction(fed,cmd);
      }
      ActionMessage::~ActionMessage(&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p == &local_128.field_2) {
        return;
      }
      goto LAB_002b1bcb;
    }
    if (aVar8 == cmd_query_reply_ordered) goto LAB_002b1798;
    if (aVar8 != cmd_broker_query_ordered) {
      return;
    }
    force_ordering = true;
  }
  iVar3 = (cmd->dest_id).gid;
  if (iVar3 != (this->super_BrokerBase).global_broker_id_local.gid && iVar3 != -0x396fe) {
    routeMessage(this,cmd);
    return;
  }
  queryStr._M_str = (char *)(cmd->payload).heap;
  queryStr._M_len = (cmd->payload).bufferSize;
  coreQuery_abi_cxx11_(&local_128,this,queryStr,force_ordering);
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128,
                  "#wait");
  iVar3 = (cmd->source_id).gid;
  if (iVar2 == 0) {
    if (iVar3 == -0x396fe) {
      if ((this->queryTimeouts).
          super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->queryTimeouts).
          super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
      }
      local_108._0_8_ = std::chrono::_V2::steady_clock::now();
      std::
      deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
      ::
      emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                  *)&this->queryTimeouts,&cmd->messageID,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&local_108);
    }
    aVar8 = cmd_query_reply;
    if (force_ordering != false) {
      aVar8 = cmd_query_reply_ordered;
    }
    ActionMessage::ActionMessage(&local_108,aVar8);
    local_108.dest_id.gid = (cmd->source_id).gid;
    local_108.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    local_108.messageID = cmd->messageID;
    local_108.counter = cmd->counter;
    local_50._M_dataplus._M_p = (pointer)(cmd->payload).bufferSize;
    local_50._M_string_length = (size_type)(cmd->payload).heap;
    pmVar7 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
             ::at((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                   *)mapIndex,(key_type *)&local_50);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               ((long)&(((this->mapBuilders).
                         super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       ).
                       super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       .
                       super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                       ._M_head_impl.
                       super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                       ._M_impl.super__Vector_impl_data._M_start +
               (ulong)((uint)pmVar7->first * 0x60)),&local_108);
LAB_002b1bb3:
    ActionMessage::~ActionMessage(&local_108);
  }
  else {
    if (iVar3 != -0x396fe) {
      aVar8 = cmd_query_reply;
      if (force_ordering != false) {
        aVar8 = cmd_query_reply_ordered;
      }
      ActionMessage::ActionMessage(&local_108,aVar8);
      local_108.payload.bufferSize = local_128._M_string_length;
      _Var1._M_p = local_128._M_dataplus._M_p;
      local_108.dest_id.gid = (cmd->source_id).gid;
      local_108.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      local_108.messageID = cmd->messageID;
      if ((byte *)local_128._M_dataplus._M_p == local_108.payload.heap) {
      }
      else {
        SmallBuffer::reserve(&local_108.payload,local_128._M_string_length);
        if (local_108.payload.bufferSize != 0) {
          memcpy(local_108.payload.heap,_Var1._M_p,local_108.payload.bufferSize);
        }
      }
      local_108.counter = cmd->counter;
      rVar5 = getRoute(this,local_108.dest_id);
      (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)(uint)rVar5.rid,&local_108);
      goto LAB_002b1bb3;
    }
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,cmd->messageID,&local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == &local_128.field_2) {
    return;
  }
LAB_002b1bcb:
  operator_delete(local_128._M_dataplus._M_p,
                  CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                           local_128.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void CommonCore::processQueryCommand(ActionMessage& cmd)
{
    bool force_ordered{false};
    switch (cmd.action()) {
        case CMD_BROKER_QUERY_ORDERED:
            force_ordered = true;
            [[fallthrough]];
        case CMD_BROKER_QUERY:

            if (cmd.dest_id == global_broker_id_local || cmd.dest_id == gDirectCoreId) {
                std::string repStr = coreQuery(cmd.payload.to_string(), force_ordered);
                if (repStr != "#wait") {
                    if (cmd.source_id == gDirectCoreId) {
                        activeQueries.setDelayedValue(cmd.messageID, std::move(repStr));
                    } else {
                        ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED :
                                                                CMD_QUERY_REPLY);
                        queryResp.dest_id = cmd.source_id;
                        queryResp.source_id = global_broker_id_local;
                        queryResp.messageID = cmd.messageID;
                        queryResp.payload = std::move(repStr);
                        queryResp.counter = cmd.counter;
                        transmit(getRoute(queryResp.dest_id), queryResp);
                    }
                } else {
                    if (cmd.source_id == gDirectCoreId) {
                        if (queryTimeouts.empty()) {
                            setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                        }
                        queryTimeouts.emplace_back(cmd.messageID, std::chrono::steady_clock::now());
                    }
                    ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED :
                                                            CMD_QUERY_REPLY);
                    queryResp.dest_id = cmd.source_id;
                    queryResp.source_id = global_broker_id_local;
                    queryResp.messageID = cmd.messageID;
                    queryResp.counter = cmd.counter;
                    std::get<1>(mapBuilders[mapIndex.at(cmd.payload.to_string()).first])
                        .push_back(queryResp);
                }

            } else {
                routeMessage(std::move(cmd));
            }
            break;
        case CMD_QUERY_ORDERED:
            force_ordered = true;
            [[fallthrough]];
        case CMD_QUERY:
            if (cmd.dest_id == parent_broker_id) {
                if (cmd.source_id == gDirectCoreId) {
                    if (queryTimeouts.empty()) {
                        setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
                    }
                    queryTimeouts.emplace_back(cmd.messageID, std::chrono::steady_clock::now());
                }
                const auto& target = cmd.getString(targetStringLoc);
                if (target == "root" || target == "federation") {
                    cmd.setAction(force_ordered ? CMD_BROKER_QUERY_ORDERED : CMD_BROKER_QUERY);
                    cmd.dest_id = gRootBrokerID;
                    cmd.clearStringData();
                } else if (target == "parent" || target == "broker") {
                    cmd.setAction(force_ordered ? CMD_BROKER_QUERY_ORDERED : CMD_BROKER_QUERY);
                    cmd.dest_id = higher_broker_id;
                    cmd.clearStringData();
                }
                if (global_broker_id_local != parent_broker_id) {
                    // forward on to Broker
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, std::move(cmd));
                } else {
                    // this will get processed when this core is assigned a global hid
                    cmd.source_id = gDirectCoreId;
                    delayTransmitQueue.push(std::move(cmd));
                }
            } else {
                std::string repStr;
                ActionMessage queryResp(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
                queryResp.dest_id = cmd.source_id;
                queryResp.source_id = cmd.dest_id;
                queryResp.messageID = cmd.messageID;
                queryResp.counter = cmd.counter;
                const std::string& target = cmd.getString(targetStringLoc);
                if (target == getIdentifier()) {
                    queryResp.source_id = global_broker_id_local;
                    repStr = coreQuery(cmd.payload.to_string(), force_ordered);
                } else {
                    auto* fedptr = getFederateCore(target);
                    repStr = federateQuery(fedptr, cmd.payload.to_string(), force_ordered);
                    if (repStr == "#wait") {
                        if (fedptr != nullptr) {
                            cmd.dest_id = fedptr->global_id;
                            fedptr->addAction(std::move(cmd));
                            break;
                        }
                        repStr = "#error";
                    }
                }

                queryResp.payload = std::move(repStr);
                if (queryResp.dest_id == gDirectCoreId) {
                    processQueryResponse(queryResp);
                } else {
                    transmit(getRoute(queryResp.dest_id), queryResp);
                }
            }
            break;
        case CMD_QUERY_REPLY:
        case CMD_QUERY_REPLY_ORDERED:
            if (cmd.dest_id == global_broker_id_local || cmd.dest_id == gDirectCoreId) {
                processQueryResponse(cmd);
            } else {
                transmit(getRoute(cmd.dest_id), cmd);
            }
            break;
        default:
            break;
    }
}